

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulet3d.cpp
# Opt level: O0

void __thiscall TPZIntRuleT3D::Loc(TPZIntRuleT3D *this,int i,TPZVec<double> *Points)

{
  longdouble lVar1;
  longdouble *plVar2;
  double *pdVar3;
  TPZVec<double> *in_RDX;
  int in_ESI;
  int *in_RDI;
  
  if ((in_ESI < 0) || (*in_RDI <= in_ESI)) {
    std::operator<<((ostream *)&std::cerr,"ERROR(TPZIntRuleT::loc) Out of bounds!!\n");
  }
  else {
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 4),(long)in_ESI);
    lVar1 = *plVar2;
    pdVar3 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar3 = (double)lVar1;
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 0x34),(long)in_ESI);
    lVar1 = *plVar2;
    pdVar3 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar3 = (double)lVar1;
    plVar2 = TPZVec<long_double>::operator[]((TPZVec<long_double> *)(in_RDI + 100),(long)in_ESI);
    lVar1 = *plVar2;
    pdVar3 = TPZVec<double>::operator[](in_RDX,2);
    *pdVar3 = (double)lVar1;
  }
  return;
}

Assistant:

void TPZIntRuleT3D::Loc(int i, TPZVec<REAL> &Points) const {
	if(i>=0 && i<fNumInt){
		Points[0] = fLocationKsi[i];
		Points[1] = fLocationEta[i];
		Points[2] = fLocationZeta[i];
		return;
	}
	else {
		PZError << "ERROR(TPZIntRuleT::loc) Out of bounds!!\n";
	}
}